

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O3

bool __thiscall DOptionMenu::MouseEvent(DOptionMenu *this,int type,int x,int y)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  FOptionMenuDescriptor *pFVar4;
  uint y_00;
  FOptionMenuItem *pFVar5;
  
  pFVar5 = this->mFocusControl;
  pFVar4 = this->mDesc;
  y_00 = y / CleanYfac_1 - pFVar4->mDrawTop;
  if (pFVar5 != (FOptionMenuItem *)0x0) {
LAB_0033edb7:
    (*(pFVar5->super_FListMenuItem)._vptr_FListMenuItem[0xe])
              (pFVar5,(ulong)(uint)type,(ulong)(uint)x,(ulong)y_00);
    return true;
  }
  uVar2 = (int)y_00 / OptionSettings.mLinespacing;
  if (pFVar4->mScrollTop <= (int)uVar2) {
    uVar2 = uVar2 + pFVar4->mScrollPos;
  }
  if (uVar2 < (pFVar4->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Count) {
    pFVar5 = (pFVar4->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[(int)uVar2];
    iVar3 = (*(pFVar5->super_FListMenuItem)._vptr_FListMenuItem[5])
                      (pFVar5,&OptionSettings,
                       (long)(int)y_00 % (long)OptionSettings.mLinespacing & 0xffffffff);
    pFVar4 = this->mDesc;
    if ((char)iVar3 != '\0') {
      if (uVar2 != pFVar4->mSelectedItem) {
        pFVar4->mSelectedItem = uVar2;
      }
      pFVar5 = (pFVar4->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>.Array[(int)uVar2]
      ;
      goto LAB_0033edb7;
    }
  }
  pFVar4->mSelectedItem = -1;
  bVar1 = DMenu::MouseEvent(&this->super_DMenu,type,x,y_00);
  return bVar1;
}

Assistant:

bool DOptionMenu::MouseEvent(int type, int x, int y)
{
	y = (y / CleanYfac_1) - mDesc->mDrawTop;

	if (mFocusControl)
	{
		mFocusControl->MouseEvent(type, x, y);
		return true;
	}
	else
	{
		int yline = (y / OptionSettings.mLinespacing);
		if (yline >= mDesc->mScrollTop)
		{
			yline += mDesc->mScrollPos;
		}
		if ((unsigned)yline < mDesc->mItems.Size() && mDesc->mItems[yline]->Selectable())
		{
			if (yline != mDesc->mSelectedItem)
			{
				mDesc->mSelectedItem = yline;
				//S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
			}
			mDesc->mItems[yline]->MouseEvent(type, x, y);
			return true;
		}
	}
	mDesc->mSelectedItem = -1;
	return Super::MouseEvent(type, x, y);
}